

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlNodeSimulate(Ssw_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2c6,"void Ssw_SmlNodeSimulate(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2c7,"void Ssw_SmlNodeSimulate(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2c8,"void Ssw_SmlNodeSimulate(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2c9,"void Ssw_SmlNodeSimulate(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  iVar1 = p->nWordsTotal;
  pAVar2 = pObj->pFanin0;
  pAVar3 = pObj->pFanin1;
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    uVar11 = 1;
  }
  else {
    uVar11 = ((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
  }
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    bVar10 = 1;
  }
  else {
    bVar10 = ((byte)pAVar3 ^ (byte)(*(uint *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18) >> 3)) &
             1;
  }
  lVar8 = (long)(pObj->Id * iVar1);
  lVar4 = (long)(iFrame * p->nWordsFrame);
  lVar5 = (long)(*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24) * iVar1);
  lVar7 = (long)(iVar1 * *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24));
  uVar9 = *(uint *)&pObj->field_0x18 >> 3;
  if ((uVar11 == 0) || (bVar10 == 0)) {
    if (uVar11 == 0 || bVar10 != 0) {
      iVar1 = p->nWordsFrame;
      if ((uVar11 == 0 & bVar10) == 1) {
        if ((uVar9 & 1) == 0) {
          if (0 < iVar1) {
            lVar4 = lVar4 * 4;
            lVar6 = 0;
            do {
              *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
                   ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) &
                   *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 < p->nWordsFrame);
          }
        }
        else if (0 < iVar1) {
          lVar4 = lVar4 * 4;
          lVar6 = 0;
          do {
            *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
                 ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4) |
                 *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 < p->nWordsFrame);
        }
      }
      else if ((uVar9 & 1) == 0) {
        if (0 < iVar1) {
          lVar4 = lVar4 * 4;
          lVar6 = 0;
          do {
            *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
                 *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) &
                 *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 < p->nWordsFrame);
        }
      }
      else if (0 < iVar1) {
        lVar4 = lVar4 * 4;
        lVar6 = 0;
        do {
          *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
               ~(*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) &
                *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4));
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nWordsFrame);
      }
    }
    else if ((uVar9 & 1) == 0) {
      if (0 < p->nWordsFrame) {
        lVar4 = lVar4 * 4;
        lVar6 = 0;
        do {
          *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
               ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4) &
               *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nWordsFrame);
      }
    }
    else if (0 < p->nWordsFrame) {
      lVar4 = lVar4 * 4;
      lVar6 = 0;
      do {
        *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
             ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) |
             *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nWordsFrame);
    }
  }
  else if ((uVar9 & 1) == 0) {
    if (0 < p->nWordsFrame) {
      lVar4 = lVar4 * 4;
      lVar6 = 0;
      do {
        *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
             ~(*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) |
              *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4));
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nWordsFrame);
    }
  }
  else if (0 < p->nWordsFrame) {
    lVar4 = lVar4 * 4;
    lVar6 = 0;
    do {
      *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar8 * 4) =
           *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar7 * 4) |
           *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar4 + lVar5 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nWordsFrame);
  }
  return;
}

Assistant:

void Ssw_SmlNodeSimulate( Ssw_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( iFrame < p->nFrames );
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Ssw_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Ssw_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    pSims1 = Ssw_ObjSim(p, Aig_ObjFanin1(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    fCompl1 = Aig_ObjPhaseReal(Aig_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] | pSims1[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | ~pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] & pSims1[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & ~pSims1[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] & pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & pSims1[i]);
    }
}